

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O3

void Hacl_Salsa20_hsalsa20(uint8_t *output,uint8_t *key,uint8_t *nonce)

{
  uint32_t local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_78 = 0x61707865;
  local_74 = *(undefined8 *)key;
  uStack_6c = *(undefined8 *)(key + 8);
  local_64 = 0x3320646e;
  local_60 = *(undefined8 *)nonce;
  uStack_58 = *(undefined8 *)(nonce + 8);
  local_50 = 0x79622d32;
  local_4c = *(undefined8 *)(key + 0x10);
  uStack_44 = *(undefined8 *)(key + 0x18);
  local_3c = 0x6b206574;
  Hacl_Impl_Salsa20_rounds(&local_78);
  *(undefined8 *)(output + 0x10) = local_60;
  *(undefined8 *)(output + 0x18) = uStack_58;
  *(uint32_t *)output = local_78;
  *(undefined4 *)(output + 4) = local_64;
  *(undefined4 *)(output + 8) = local_50;
  *(undefined4 *)(output + 0xc) = local_3c;
  return;
}

Assistant:

void Hacl_Salsa20_hsalsa20(uint8_t *output, uint8_t *key, uint8_t *nonce)
{
  Hacl_Impl_HSalsa20_crypto_core_hsalsa20(output, nonce, key);
}